

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lysp_check_dup_groupings(lysp_ctx *ctx,lysp_module *mod)

{
  ly_ht *grps_global;
  ulong local_50;
  LY_ERR local_40;
  uint local_3c;
  LY_ERR ret;
  uint32_t i;
  uint64_t u;
  lysp_node_grp *grp_iter;
  lysp_node_grp *groupings;
  ly_ht *ids_global;
  lysp_module *mod_local;
  lysp_ctx *ctx_local;
  
  local_40 = LY_SUCCESS;
  grps_global = lyht_new(8,8,lysp_id_cmp,(void *)0x0,1);
  for (u = (uint64_t)mod->groupings; u != 0; u = *(uint64_t *)(u + 0x10)) {
    local_40 = lysp_check_dup_grouping(ctx,(lysp_node *)0x0,(lysp_node_grp *)u,grps_global);
    if (local_40 != LY_SUCCESS) goto LAB_0019e78c;
  }
  _ret = 0;
  while( true ) {
    if (mod->includes == (lysp_include *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = *(ulong *)(mod->includes[-1].rev + 8);
    }
    if (local_50 <= _ret) break;
    for (u = (uint64_t)(mod->includes[_ret].submodule)->groupings; u != 0;
        u = *(uint64_t *)(u + 0x10)) {
      local_40 = lysp_check_dup_grouping(ctx,(lysp_node *)0x0,(lysp_node_grp *)u,grps_global);
      if (local_40 != LY_SUCCESS) goto LAB_0019e78c;
    }
    _ret = _ret + 1;
  }
  for (local_3c = 0; local_3c < (ctx->grps_nodes).count; local_3c = local_3c + 1) {
    for (u = (uint64_t)lysp_node_groupings((lysp_node *)(ctx->grps_nodes).field_2.dnodes[local_3c]);
        u != 0; u = *(uint64_t *)(u + 0x10)) {
      local_40 = lysp_check_dup_grouping
                           (ctx,(lysp_node *)(ctx->grps_nodes).field_2.dnodes[local_3c],
                            (lysp_node_grp *)u,grps_global);
      if (local_40 != LY_SUCCESS) goto LAB_0019e78c;
    }
  }
LAB_0019e78c:
  lyht_free(grps_global,(_func_void_void_ptr *)0x0);
  return local_40;
}

Assistant:

LY_ERR
lysp_check_dup_groupings(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    struct ly_ht *ids_global;
    const struct lysp_node_grp *groupings, *grp_iter;
    LY_ARRAY_COUNT_TYPE u;
    uint32_t i;
    LY_ERR ret = LY_SUCCESS;

    ids_global = lyht_new(LYHT_MIN_SIZE, sizeof(char *), lysp_id_cmp, NULL, 1);
    LY_LIST_FOR(mod->groupings, grp_iter) {
        ret = lysp_check_dup_grouping(ctx, NULL, grp_iter, ids_global);
        LY_CHECK_GOTO(ret, cleanup);
    }
    LY_ARRAY_FOR(mod->includes, u) {
        LY_LIST_FOR(mod->includes[u].submodule->groupings, grp_iter) {
            ret = lysp_check_dup_grouping(ctx, NULL, grp_iter, ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }
    for (i = 0; i < ctx->grps_nodes.count; ++i) {
        groupings = lysp_node_groupings((struct lysp_node *)ctx->grps_nodes.objs[i]);
        LY_LIST_FOR(groupings, grp_iter) {
            ret = lysp_check_dup_grouping(ctx, (struct lysp_node *)ctx->grps_nodes.objs[i], grp_iter, ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ids_global, NULL);
    return ret;
}